

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

void __thiscall pm::World::clear(World *this)

{
  Light *pLVar1;
  _Head_base<0UL,_pm::Light_*,_false> _Var2;
  _Head_base<0UL,_pm::Light_*,_false> local_20;
  undefined4 local_14;
  
  (this->background_).r = 0.0;
  (this->background_).g = 0.0;
  (this->background_).b = 0.0;
  local_14 = 0;
  std::make_unique<pm::Ambient,float>((float *)&local_20);
  _Var2._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (Light *)0x0;
  pLVar1 = (this->ambientLight_)._M_t.
           super___uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>._M_t.
           super__Tuple_impl<0UL,_pm::Light_*,_std::default_delete<pm::Light>_>.
           super__Head_base<0UL,_pm::Light_*,_false>._M_head_impl;
  (this->ambientLight_)._M_t.super___uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>._M_t.
  super__Tuple_impl<0UL,_pm::Light_*,_std::default_delete<pm::Light>_>.
  super__Head_base<0UL,_pm::Light_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (pLVar1 != (Light *)0x0) {
    (*pLVar1->_vptr_Light[1])();
    if (local_20._M_head_impl != (Light *)0x0) {
      (*(local_20._M_head_impl)->_vptr_Light[1])();
    }
  }
  std::
  vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  ::clear(&this->objects_);
  std::
  vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  ::clear(&this->materials_);
  std::
  vector<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
  ::clear(&this->lights_);
  std::
  vector<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  ::clear(&this->samplers_);
  return;
}

Assistant:

void World::clear()
{
	background_.set(0.0f, 0.0f, 0.0f);
	ambientLight_ = std::make_unique<Ambient>(0.0f);
	objects_.clear();
	materials_.clear();
	lights_.clear();
	samplers_.clear();
}